

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O0

curl_httppost *
AddHttpPost(char *name,size_t namelength,char *value,curl_off_t contentslength,char *buffer,
           size_t bufferlength,char *contenttype,long flags,curl_slist *contentHeader,
           char *showfilename,char *userp,curl_httppost *parent_post,curl_httppost **httppost,
           curl_httppost **last_post)

{
  size_t local_58;
  size_t local_50;
  curl_httppost *post;
  size_t bufferlength_local;
  char *buffer_local;
  curl_off_t contentslength_local;
  char *value_local;
  size_t namelength_local;
  char *name_local;
  
  name_local = (char *)(*Curl_ccalloc)(1,0x70);
  if ((curl_httppost *)name_local == (curl_httppost *)0x0) {
    name_local = (char *)0x0;
  }
  else {
    ((curl_httppost *)name_local)->name = name;
    if (name == (char *)0x0) {
      local_58 = 0;
    }
    else {
      local_50 = namelength;
      if (namelength == 0) {
        local_50 = strlen(name);
      }
      local_58 = local_50;
    }
    ((curl_httppost *)name_local)->namelength = local_58;
    ((curl_httppost *)name_local)->contents = value;
    ((curl_httppost *)name_local)->contentlen = contentslength;
    ((curl_httppost *)name_local)->buffer = buffer;
    ((curl_httppost *)name_local)->bufferlength = bufferlength;
    ((curl_httppost *)name_local)->contenttype = contenttype;
    ((curl_httppost *)name_local)->contentheader = contentHeader;
    ((curl_httppost *)name_local)->showfilename = showfilename;
    ((curl_httppost *)name_local)->userp = userp;
    ((curl_httppost *)name_local)->flags = flags | 0x80;
    if (parent_post == (curl_httppost *)0x0) {
      if (*last_post == (curl_httppost *)0x0) {
        *httppost = (curl_httppost *)name_local;
      }
      else {
        (*last_post)->next = (curl_httppost *)name_local;
      }
      *last_post = (curl_httppost *)name_local;
    }
    else {
      ((curl_httppost *)name_local)->more = parent_post->more;
      parent_post->more = (curl_httppost *)name_local;
    }
  }
  return (curl_httppost *)name_local;
}

Assistant:

static struct curl_httppost *
AddHttpPost(char *name, size_t namelength,
            char *value, curl_off_t contentslength,
            char *buffer, size_t bufferlength,
            char *contenttype,
            long flags,
            struct curl_slist *contentHeader,
            char *showfilename, char *userp,
            struct curl_httppost *parent_post,
            struct curl_httppost **httppost,
            struct curl_httppost **last_post)
{
  struct curl_httppost *post;
  post = calloc(1, sizeof(struct curl_httppost));
  if(post) {
    post->name = name;
    post->namelength = (long)(name?(namelength?namelength:strlen(name)):0);
    post->contents = value;
    post->contentlen = contentslength;
    post->buffer = buffer;
    post->bufferlength = (long)bufferlength;
    post->contenttype = contenttype;
    post->contentheader = contentHeader;
    post->showfilename = showfilename;
    post->userp = userp,
    post->flags = flags | CURL_HTTPPOST_LARGE;
  }
  else
    return NULL;

  if(parent_post) {
    /* now, point our 'more' to the original 'more' */
    post->more = parent_post->more;

    /* then move the original 'more' to point to ourselves */
    parent_post->more = post;
  }
  else {
    /* make the previous point to this */
    if(*last_post)
      (*last_post)->next = post;
    else
      (*httppost) = post;

    (*last_post) = post;
  }
  return post;
}